

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O1

int testInvalidConcatNdWrongAxis(void)

{
  RepeatedField<long> *pRVar1;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this;
  RepeatedPtrField<CoreML::Specification::Tensor> *this_00;
  uint uVar2;
  uint uVar3;
  Rep *pRVar4;
  ulong uVar5;
  ConvolutionLayerParams *pCVar6;
  bool bVar7;
  FeatureType *pFVar8;
  ArrayFeatureType *pAVar9;
  long *plVar10;
  FeatureDescription *pFVar11;
  NeuralNetworkLayer *pNVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  Tensor *pTVar14;
  void *pvVar15;
  ConcatNDLayerParams *pCVar16;
  ostream *poVar17;
  string *psVar18;
  long lVar19;
  undefined8 *puVar20;
  int iVar21;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar22;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *this_01;
  uint32_t size;
  uint uVar23;
  Arena *pAVar24;
  Model m;
  Result res;
  Model MStack_78;
  Result local_48;
  
  CoreML::Specification::Model::Model(&MStack_78,(Arena *)0x0,false);
  if (MStack_78.description_ == (ModelDescription *)0x0) {
    pAVar24 = (Arena *)(MStack_78.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_78.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar24 = *(Arena **)pAVar24;
    }
    MStack_78.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar24);
  }
  pRVar4 = ((MStack_78.description_)->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001b3225:
    pRVar22 = &(MStack_78.description_)->input_;
    pFVar11 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pRVar22->super_RepeatedPtrFieldBase).arena_);
    pvVar15 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar22->super_RepeatedPtrFieldBase,pFVar11);
  }
  else {
    iVar21 = ((MStack_78.description_)->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar21) goto LAB_001b3225;
    ((MStack_78.description_)->input_).super_RepeatedPtrFieldBase.current_size_ = iVar21 + 1;
    pvVar15 = pRVar4->elements[iVar21];
  }
  puVar20 = (undefined8 *)(*(ulong *)((long)pvVar15 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar15 + 8) & 1) != 0) {
    puVar20 = (undefined8 *)*puVar20;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar15 + 0x10),"input",puVar20);
  if (*(long *)((long)pvVar15 + 0x20) == 0) {
    pAVar24 = (Arena *)(*(ulong *)((long)pvVar15 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar15 + 8) & 1) != 0) {
      pAVar24 = *(Arena **)pAVar24;
    }
    pFVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar24);
    *(FeatureType **)((long)pvVar15 + 0x20) = pFVar8;
  }
  pFVar8 = *(FeatureType **)((long)pvVar15 + 0x20);
  if (pFVar8->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar8);
    pFVar8->_oneof_case_[0] = 5;
    uVar5 = (pFVar8->super_MessageLite)._internal_metadata_.ptr_;
    pAVar24 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar24 = *(Arena **)pAVar24;
    }
    pAVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar24);
    (pFVar8->Type_).multiarraytype_ = pAVar9;
  }
  pAVar9 = (pFVar8->Type_).multiarraytype_;
  pRVar1 = &pAVar9->shape_;
  uVar2 = (pAVar9->shape_).current_size_;
  uVar3 = (pAVar9->shape_).total_size_;
  if (uVar2 == uVar3) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar3 + 1);
  }
  plVar10 = google::protobuf::RepeatedField<long>::elements(pRVar1);
  plVar10[uVar2] = 3;
  uVar23 = uVar2 + 1;
  (pAVar9->shape_).current_size_ = uVar23;
  uVar3 = (pAVar9->shape_).total_size_;
  if (uVar23 == uVar3) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar3 + 1);
  }
  plVar10 = google::protobuf::RepeatedField<long>::elements(pRVar1);
  plVar10[uVar23] = 5;
  uVar23 = uVar2 + 2;
  (pAVar9->shape_).current_size_ = uVar23;
  uVar3 = (pAVar9->shape_).total_size_;
  if (uVar23 == uVar3) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar3 + 1);
  }
  plVar10 = google::protobuf::RepeatedField<long>::elements(pRVar1);
  plVar10[uVar23] = 2;
  pRVar1->current_size_ = uVar2 + 3;
  if (MStack_78.description_ == (ModelDescription *)0x0) {
    pAVar24 = (Arena *)(MStack_78.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_78.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar24 = *(Arena **)pAVar24;
    }
    MStack_78.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar24);
  }
  pRVar4 = ((MStack_78.description_)->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001b3391:
    pRVar22 = &(MStack_78.description_)->output_;
    pFVar11 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pRVar22->super_RepeatedPtrFieldBase).arena_);
    pvVar15 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar22->super_RepeatedPtrFieldBase,pFVar11);
  }
  else {
    iVar21 = ((MStack_78.description_)->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar21) goto LAB_001b3391;
    ((MStack_78.description_)->output_).super_RepeatedPtrFieldBase.current_size_ = iVar21 + 1;
    pvVar15 = pRVar4->elements[iVar21];
  }
  puVar20 = (undefined8 *)(*(ulong *)((long)pvVar15 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar15 + 8) & 1) != 0) {
    puVar20 = (undefined8 *)*puVar20;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar15 + 0x10),"output",puVar20);
  if (*(long *)((long)pvVar15 + 0x20) == 0) {
    pAVar24 = (Arena *)(*(ulong *)((long)pvVar15 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar15 + 8) & 1) != 0) {
      pAVar24 = *(Arena **)pAVar24;
    }
    pFVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar24);
    *(FeatureType **)((long)pvVar15 + 0x20) = pFVar8;
  }
  pFVar8 = *(FeatureType **)((long)pvVar15 + 0x20);
  if (pFVar8->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar8);
    pFVar8->_oneof_case_[0] = 5;
    uVar5 = (pFVar8->super_MessageLite)._internal_metadata_.ptr_;
    pAVar24 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar24 = *(Arena **)pAVar24;
    }
    pAVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar24);
    (pFVar8->Type_).multiarraytype_ = pAVar9;
  }
  pAVar9 = (pFVar8->Type_).multiarraytype_;
  pRVar1 = &pAVar9->shape_;
  uVar2 = (pAVar9->shape_).current_size_;
  uVar3 = (pAVar9->shape_).total_size_;
  if (uVar2 == uVar3) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar3 + 1);
  }
  plVar10 = google::protobuf::RepeatedField<long>::elements(pRVar1);
  plVar10[uVar2] = 3;
  uVar23 = uVar2 + 1;
  (pAVar9->shape_).current_size_ = uVar23;
  uVar3 = (pAVar9->shape_).total_size_;
  if (uVar23 == uVar3) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar3 + 1);
  }
  plVar10 = google::protobuf::RepeatedField<long>::elements(pRVar1);
  plVar10[uVar23] = 5;
  uVar23 = uVar2 + 2;
  (pAVar9->shape_).current_size_ = uVar23;
  uVar3 = (pAVar9->shape_).total_size_;
  if (uVar23 == uVar3) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar3 + 1);
  }
  plVar10 = google::protobuf::RepeatedField<long>::elements(pRVar1);
  plVar10[uVar23] = 1;
  pRVar1->current_size_ = uVar2 + 3;
  if (MStack_78._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&MStack_78);
    MStack_78._oneof_case_[0] = 500;
    pAVar24 = (Arena *)(MStack_78.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_78.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar24 = *(Arena **)pAVar24;
    }
    MStack_78.Type_.neuralnetwork_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetwork>(pAVar24);
  }
  (MStack_78.Type_.neuralnetworkregressor_)->arrayinputshapemapping_ = 1;
  pRVar4 = (((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
            &(MStack_78.Type_.pipeline_)->models_)->super_RepeatedPtrFieldBase).rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001b3516:
    this_01 = (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
              &(MStack_78.Type_.pipeline_)->models_;
    pNVar12 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                        ((this_01->super_RepeatedPtrFieldBase).arena_);
    pNVar12 = (NeuralNetworkLayer *)
              google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        ((RepeatedPtrFieldBase *)this_01,pNVar12);
  }
  else {
    iVar21 = (MStack_78.Type_.treeensembleregressor_)->postevaluationtransform_;
    if (pRVar4->allocated_size <= iVar21) goto LAB_001b3516;
    (MStack_78.Type_.treeensembleregressor_)->postevaluationtransform_ = iVar21 + 1;
    pNVar12 = (NeuralNetworkLayer *)pRVar4->elements[iVar21];
  }
  this = &pNVar12->input_;
  pRVar4 = (pNVar12->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001b3552:
    pbVar13 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((this->super_RepeatedPtrFieldBase).arena_);
    pvVar15 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&this->super_RepeatedPtrFieldBase,pbVar13);
  }
  else {
    iVar21 = (pNVar12->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar21) goto LAB_001b3552;
    (pNVar12->input_).super_RepeatedPtrFieldBase.current_size_ = iVar21 + 1;
    pvVar15 = pRVar4->elements[iVar21];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar15,0,*(char **)((long)pvVar15 + 8),0x3b8536);
  pRVar4 = (pNVar12->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001b359e:
    pbVar13 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((this->super_RepeatedPtrFieldBase).arena_);
    pvVar15 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&this->super_RepeatedPtrFieldBase,pbVar13);
  }
  else {
    iVar21 = (pNVar12->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar21) goto LAB_001b359e;
    (pNVar12->input_).super_RepeatedPtrFieldBase.current_size_ = iVar21 + 1;
    pvVar15 = pRVar4->elements[iVar21];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar15,0,*(char **)((long)pvVar15 + 8),0x3b853d);
  pRVar4 = (pNVar12->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001b35ea:
    pbVar13 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar12->output_).super_RepeatedPtrFieldBase.arena_);
    pvVar15 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar12->output_).super_RepeatedPtrFieldBase,pbVar13);
  }
  else {
    iVar21 = (pNVar12->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar21) goto LAB_001b35ea;
    (pNVar12->output_).super_RepeatedPtrFieldBase.current_size_ = iVar21 + 1;
    pvVar15 = pRVar4->elements[iVar21];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar15,0,*(char **)((long)pvVar15 + 8),0x3dece7);
  this_00 = &pNVar12->inputtensor_;
  pRVar4 = (pNVar12->inputtensor_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001b363e:
    pTVar14 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Tensor>
                        ((this_00->super_RepeatedPtrFieldBase).arena_);
    pvVar15 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&this_00->super_RepeatedPtrFieldBase,pTVar14);
  }
  else {
    iVar21 = (pNVar12->inputtensor_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar21) goto LAB_001b363e;
    (pNVar12->inputtensor_).super_RepeatedPtrFieldBase.current_size_ = iVar21 + 1;
    pvVar15 = pRVar4->elements[iVar21];
  }
  *(undefined4 *)((long)pvVar15 + 0x24) = 3;
  pRVar4 = (pNVar12->inputtensor_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001b3676:
    pTVar14 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Tensor>
                        ((this_00->super_RepeatedPtrFieldBase).arena_);
    pvVar15 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&this_00->super_RepeatedPtrFieldBase,pTVar14);
  }
  else {
    iVar21 = (pNVar12->inputtensor_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar21) goto LAB_001b3676;
    (pNVar12->inputtensor_).super_RepeatedPtrFieldBase.current_size_ = iVar21 + 1;
    pvVar15 = pRVar4->elements[iVar21];
  }
  *(undefined4 *)((long)pvVar15 + 0x24) = 3;
  if (pNVar12->_oneof_case_[0] != 0x3d4) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar12);
    pNVar12->_oneof_case_[0] = 0x3d4;
    uVar5 = (pNVar12->super_MessageLite)._internal_metadata_.ptr_;
    pAVar24 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar24 = *(Arena **)pAVar24;
    }
    pCVar16 = google::protobuf::Arena::
              CreateMaybeMessage<CoreML::Specification::ConcatNDLayerParams>(pAVar24);
    (pNVar12->layer_).concatnd_ = pCVar16;
  }
  pCVar6 = (pNVar12->layer_).convolution_;
  (pCVar6->kernelsize_).current_size_ = -4;
  (pCVar6->kernelsize_).total_size_ = -1;
  CoreML::validate<(MLModelType)500>(&local_48,&MStack_78);
  bVar7 = CoreML::Result::good(&local_48);
  if (bVar7) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x68);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar17 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x13f5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
  }
  else {
    psVar18 = CoreML::Result::message_abi_cxx11_(&local_48);
    iVar21 = 0;
    lVar19 = std::__cxx11::string::find((char *)psVar18,0x3b8c90,0);
    if (lVar19 != -1) goto LAB_001b386c;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x68);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar17 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x13f6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar17,"res.message().find(\"axis\") != std::string::npos",0x2f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
  }
  std::ostream::put((char)poVar17);
  iVar21 = 1;
  std::ostream::flush();
LAB_001b386c:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.m_message._M_dataplus._M_p != &local_48.m_message.field_2) {
    operator_delete(local_48.m_message._M_dataplus._M_p,
                    local_48.m_message.field_2._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&MStack_78);
  return iVar21;
}

Assistant:

int testInvalidConcatNdWrongAxis() {

    Specification::Model m;

    auto *in = m.mutable_description()->add_input();
    in->set_name("input");
    auto *inShape = in->mutable_type()->mutable_multiarraytype();
    inShape->add_shape(3);
    inShape->add_shape(5);
    inShape->add_shape(2);

    auto *out = m.mutable_description()->add_output();
    out->set_name("output");
    auto *outShape = out->mutable_type()->mutable_multiarraytype();
    outShape->add_shape(3);
    outShape->add_shape(5);
    outShape->add_shape(1);

    const auto nn = m.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    auto *layers = nn->add_layers();
    layers->add_input("input1");
    layers->add_input("input2");
    layers->add_output("output");
    layers->add_inputtensor()->set_rank(3);
    layers->add_inputtensor()->set_rank(3);

    auto *params = layers->mutable_concatnd();
    params->set_axis(-4);

    // axis should be in range [-rank, rank)
    Result res = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res);
    ML_ASSERT(res.message().find("axis") != std::string::npos);

    return 0;

}